

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O1

void __thiscall
HACD::HullLibrary::BringOutYourDead
          (HullLibrary *this,HaF32 *verts,HaU32 vcount,HaF32 *overts,HaU32 *ocount,HaU32 *indices,
          HaU32 indexcount)

{
  int iVar1;
  HaU32 HVar2;
  void *__s;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  __s = malloc((ulong)vcount << 2);
  memset(__s,0,(ulong)vcount << 2);
  *ocount = 0;
  if (indexcount != 0) {
    lVar3 = 0;
    do {
      uVar5 = indices[lVar3];
      uVar4 = (ulong)uVar5;
      if (vcount <= uVar5) {
        __assert_fail("v < vcount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                      ,0xc1,
                      "void HACD::HullLibrary::BringOutYourDead(const hacd::HaF32 *, hacd::HaU32, hacd::HaF32 *, hacd::HaU32 &, hacd::HaU32 *, hacd::HaU32)"
                     );
      }
      iVar1 = *(int *)((long)__s + uVar4 * 4);
      if (iVar1 == 0) {
        indices[lVar3] = *ocount;
        HVar2 = *ocount;
        overts[HVar2 * 3] = verts[uVar5 * 3];
        overts[HVar2 * 3 + 1] = verts[uVar4 * 3 + 1 & 0xffffffff];
        overts[HVar2 * 3 + 2] = verts[uVar4 * 3 + 2 & 0xffffffff];
        uVar5 = HVar2 + 1;
        *ocount = uVar5;
        if (vcount < uVar5) {
          __assert_fail("ocount <= vcount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                        ,0xd2,
                        "void HACD::HullLibrary::BringOutYourDead(const hacd::HaF32 *, hacd::HaU32, hacd::HaF32 *, hacd::HaU32 &, hacd::HaU32 *, hacd::HaU32)"
                       );
        }
        *(uint *)((long)__s + uVar4 * 4) = uVar5;
      }
      else {
        indices[lVar3] = iVar1 - 1;
      }
      lVar3 = lVar3 + 1;
    } while (indexcount != (HaU32)lVar3);
  }
  free(__s);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const hacd::HaF32 *verts,hacd::HaU32 vcount, hacd::HaF32 *overts,hacd::HaU32 &ocount,hacd::HaU32 *indices,hacd::HaU32 indexcount)
{
	hacd::HaU32 *used = (hacd::HaU32 *)HACD_ALLOC(sizeof(hacd::HaU32)*vcount);
	memset(used,0,sizeof(hacd::HaU32)*vcount);

	ocount = 0;

	for (hacd::HaU32 i=0; i<indexcount; i++)
	{
		hacd::HaU32 v = indices[i]; // original array index

		HACD_ASSERT( v < vcount );

		if ( used[v] ) // if already remapped
		{
			indices[i] = used[v]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount*3+0] = verts[v*3+0]; // copy old vert to new vert array
			overts[ocount*3+1] = verts[v*3+1];
			overts[ocount*3+2] = verts[v*3+2];

			ocount++; // increment output vert count

			HACD_ASSERT( ocount <= vcount );

			used[v] = ocount; // assign new index remapping
		}
	}

	HACD_FREE(used);
}